

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend.c
# Opt level: O0

int bindkey(KEYMAP **mapp,char *fname,KCHAR *keys,int kcount)

{
  short sVar1;
  int iVar2;
  KEYMAP *pKVar3;
  PF p_Var4;
  code *pcStack_48;
  int c;
  PF funct;
  KEYMAP *pref_map;
  KEYMAP *curmap;
  short *psStack_28;
  int kcount_local;
  KCHAR *keys_local;
  char *fname_local;
  KEYMAP **mapp_local;
  
  pref_map = *mapp;
  funct = (PF)0x0;
  curmap._4_4_ = kcount;
  psStack_28 = keys;
  keys_local = (KCHAR *)fname;
  fname_local = (char *)mapp;
  if (fname == (char *)0x0) {
    pcStack_48 = rescan;
  }
  else {
    pcStack_48 = name_function(fname);
    pKVar3 = (KEYMAP *)pcStack_48;
    if ((KEYMAP *)pcStack_48 == (KEYMAP *)0x0) {
      funct = (PF)name_map((char *)keys_local);
      pKVar3 = (KEYMAP *)funct;
    }
    if (pKVar3 == (KEYMAP *)0x0) {
      dobeep();
      ewprintf("[No match: %s]",keys_local);
      return 0;
    }
  }
  while( true ) {
    do {
      curmap._4_4_ = curmap._4_4_ + -1;
      if (curmap._4_4_ == 0) {
        sVar1 = *psStack_28;
        doscan(pref_map,(int)sVar1,(KEYMAP **)0x0);
        iVar2 = remap(pref_map,(int)sVar1,pcStack_48,(KEYMAP *)funct);
        return iVar2;
      }
      sVar1 = *psStack_28;
      psStack_28 = psStack_28 + 1;
      p_Var4 = doscan(pref_map,(int)sVar1,&pref_map);
    } while (p_Var4 == (PF)0x0);
    iVar2 = remap(pref_map,(int)sVar1,(PF)0x0,(KEYMAP *)0x0);
    if (iVar2 != 1) break;
    pref_map = ele->k_prefmap;
  }
  return 0;
}

Assistant:

static int
bindkey(KEYMAP **mapp, const char *fname, KCHAR *keys, int kcount)
{
	KEYMAP	*curmap = *mapp;
	KEYMAP	*pref_map = NULL;
	PF	 funct;
	int	 c;

	if (fname == NULL)
		funct = rescan;
	else if (((funct = name_function(fname)) == NULL) ?
	    (pref_map = name_map(fname)) == NULL : funct == NULL) {
		dobeep();
		ewprintf("[No match: %s]", fname);
		return (FALSE);
	}
	while (--kcount) {
		if (doscan(curmap, c = *keys++, &curmap) != NULL) {
			if (remap(curmap, c, NULL, NULL) != TRUE)
				return (FALSE);
			/*
			 * XXX - Bizzarreness. remap creates an empty KEYMAP
			 *       that the last key is supposed to point to.
			 */
			curmap = ele->k_prefmap;
		}
	}
	(void)doscan(curmap, c = *keys, NULL);
	return (remap(curmap, c, funct, pref_map));
}